

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_convolve_y_sr_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  ushort uVar1;
  int16_t *piVar2;
  ushort *puVar3;
  long lVar4;
  uint16_t uVar5;
  uint uVar6;
  ushort *puVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong local_58;
  ushort *local_50;
  
  if (0 < h) {
    uVar1 = filter_params_y->taps;
    piVar2 = filter_params_y->filter_ptr;
    lVar4 = (long)src_stride;
    local_50 = src + (1 - (ulong)(uVar1 >> 1)) * lVar4;
    local_58 = 0;
    do {
      if (0 < w) {
        uVar10 = 0;
        puVar3 = local_50;
        do {
          if ((ulong)filter_params_y->taps == 0) {
            uVar9 = 0;
          }
          else {
            uVar11 = 0;
            iVar8 = 0;
            puVar7 = puVar3;
            do {
              iVar8 = iVar8 + (uint)*puVar7 *
                              (int)*(short *)((long)piVar2 +
                                             uVar11 * 2 +
                                             (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
              uVar11 = uVar11 + 1;
              puVar7 = puVar7 + lVar4;
            } while (filter_params_y->taps != uVar11);
            uVar9 = iVar8 + 0x40 >> 7;
          }
          if (bd == 10) {
            uVar6 = 0x3ff;
          }
          else if (bd == 0xc) {
            uVar6 = 0xfff;
          }
          else {
            uVar6 = 0xff;
          }
          if (uVar9 < uVar6) {
            uVar6 = uVar9;
          }
          uVar5 = (uint16_t)uVar6;
          if ((int)uVar9 < 0) {
            uVar5 = 0;
          }
          dst[local_58 * (long)dst_stride + uVar10] = uVar5;
          uVar10 = uVar10 + 1;
          puVar3 = puVar3 + 1;
        } while (uVar10 != (uint)w);
      }
      local_58 = local_58 + 1;
      local_50 = local_50 + lVar4;
    } while (local_58 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_c(const uint16_t *src, int src_stride,
                                uint16_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_y,
                                const int subpel_y_qn, int bd) {
  const int fo_vert = filter_params_y->taps / 2 - 1;
  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      dst[y * dst_stride + x] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(res, FILTER_BITS), bd);
    }
  }
}